

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  undefined8 uVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) {
      UnitTest::GetInstance();
      iVar1 = chdir(((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                    _M_dataplus._M_p);
      if (iVar1 == 0) {
        execv(**child_arg,*child_arg);
        local_98 = &local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"execv(","");
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_118 = (ulong *)*plVar3;
        puVar6 = (ulong *)(plVar3 + 2);
        if (local_118 == puVar6) {
          local_108 = *puVar6;
          lStack_100 = plVar3[3];
          local_118 = &local_108;
        }
        else {
          local_108 = *puVar6;
        }
        local_110 = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_118);
        local_f8 = (long *)*plVar3;
        plVar5 = plVar3 + 2;
        if (local_f8 == plVar5) {
          local_e8 = *plVar5;
          lStack_e0 = plVar3[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar5;
        }
        local_f0 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_b8 = (long *)*plVar3;
        plVar5 = plVar3 + 2;
        if (local_b8 == plVar5) {
          local_a8 = *plVar5;
          lStack_a0 = plVar3[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar5;
        }
        local_b0 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_138._M_dataplus._M_p = (pointer)*plVar3;
        psVar7 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_138._M_dataplus._M_p == psVar7) {
          local_138.field_2._M_allocated_capacity = *psVar7;
          local_138.field_2._8_8_ = plVar3[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar7;
        }
        local_138._M_string_length = plVar3[1];
        *plVar3 = (long)psVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        GetLastErrnoDescription_abi_cxx11_();
        std::operator+(&local_d8,&local_138,&local_58);
        DeathTestAbort(&local_d8);
      }
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"chdir(\"","");
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_b8 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_b8 == plVar5) {
        local_a8 = *plVar5;
        lStack_a0 = plVar3[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar5;
      }
      local_b0 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_138._M_dataplus._M_p = (pointer)*plVar3;
      puVar6 = (ulong *)(plVar3 + 2);
      if ((ulong *)local_138._M_dataplus._M_p == puVar6) {
        local_138.field_2._M_allocated_capacity = *puVar6;
        local_138.field_2._8_8_ = plVar3[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *puVar6;
      }
      local_138._M_string_length = plVar3[1];
      *plVar3 = (long)puVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      GetLastErrnoDescription_abi_cxx11_();
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        uVar8 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_110 + local_138._M_string_length) {
        uVar9 = 0xf;
        if (local_118 != &local_108) {
          uVar9 = local_108;
        }
        if (local_110 + local_138._M_string_length <= uVar9) {
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_118,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
          goto LAB_0015c114;
        }
      }
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_118);
LAB_0015c114:
      local_d8._M_dataplus._M_p = (pointer)*puVar4;
      psVar7 = puVar4 + 2;
      if ((size_type *)local_d8._M_dataplus._M_p == psVar7) {
        local_d8.field_2._M_allocated_capacity = *psVar7;
        local_d8.field_2._8_8_ = puVar4[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar7;
      }
      local_d8._M_string_length = puVar4[1];
      *puVar4 = psVar7;
      puVar4[1] = 0;
      *(undefined1 *)psVar7 = 0;
      DeathTestAbort(&local_d8);
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CHECK failed: File ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_98 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_98 == plVar5) {
    local_88 = *plVar5;
    lStack_80 = plVar3[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar5;
  }
  local_90 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_118 = (ulong *)*plVar3;
  puVar6 = (ulong *)(plVar3 + 2);
  if (local_118 == puVar6) {
    local_108 = *puVar6;
    lStack_100 = plVar3[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar6;
  }
  local_110 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_34 = 0x4a1;
  StreamableToString<int>(&local_78,&local_34);
  uVar9 = 0xf;
  if (local_118 != &local_108) {
    uVar9 = local_108;
  }
  if (uVar9 < local_78._M_string_length + local_110) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar8 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_110 <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_118);
      goto LAB_0015c083;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_78._M_dataplus._M_p);
LAB_0015c083:
  local_f8 = (long *)*puVar4;
  plVar3 = puVar4 + 2;
  if (local_f8 == plVar3) {
    local_e8 = *plVar3;
    lStack_e0 = puVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar3;
  }
  local_f0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_b8 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_b8 == plVar5) {
    local_a8 = *plVar5;
    lStack_a0 = plVar3[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar5;
  }
  local_b0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_138._M_dataplus._M_p = (pointer)*plVar3;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_138._M_dataplus._M_p == psVar7) {
    local_138.field_2._M_allocated_capacity = *psVar7;
    local_138.field_2._8_8_ = plVar3[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar7;
  }
  local_138._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_d8._M_dataplus._M_p = (pointer)*plVar3;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_d8._M_dataplus._M_p == psVar7) {
    local_d8.field_2._M_allocated_capacity = *psVar7;
    local_d8.field_2._8_8_ = plVar3[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar7;
  }
  local_d8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  DeathTestAbort(&local_d8);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir +
                   "\") failed: " + GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " + GetLastErrnoDescription());
  return EXIT_FAILURE;
}